

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O2

target_ulong helper_get_dr_x86_64(CPUX86State *env,int reg)

{
  target_ulong *ptVar1;
  uintptr_t unaff_retaddr;
  
  if (7 < (uint)reg) goto LAB_004c57ff;
  if ((0xcfU >> (reg & 0x1fU) & 1) == 0) {
    if (reg == 4) {
      if ((env->cr[4] & 8) != 0) {
LAB_004c57ff:
        raise_exception_err_ra_x86_64(env,6,0,unaff_retaddr);
      }
      ptVar1 = env->dr + 6;
    }
    else {
      if ((env->cr[4] & 8) != 0) goto LAB_004c57ff;
      ptVar1 = env->dr + 7;
    }
  }
  else {
    ptVar1 = env->dr + (uint)reg;
  }
  return *ptVar1;
}

Assistant:

target_ulong helper_get_dr(CPUX86State *env, int reg)
{
    switch (reg) {
    case 0: case 1: case 2: case 3: case 6: case 7:
        return env->dr[reg];
    case 4:
        if (env->cr[4] & CR4_DE_MASK) {
            break;
        } else {
            return env->dr[6];
        }
    case 5:
        if (env->cr[4] & CR4_DE_MASK) {
            break;
        } else {
            return env->dr[7];
        }
    }
    raise_exception_err_ra(env, EXCP06_ILLOP, 0, GETPC());
}